

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::asStringTest<true>(ViewTest *this)

{
  View<int,true,std::allocator<unsigned_long>> local_2e8 [36];
  undefined4 local_2c4;
  View<int,true,std::allocator<unsigned_long>> local_2c0 [39];
  allocator<int> local_299;
  undefined1 local_298 [8];
  View<int,_true,_std::allocator<unsigned_long>_> w;
  View<int,true,std::allocator<unsigned_long>> local_250 [36];
  undefined4 local_22c;
  View<int,true,std::allocator<unsigned_long>> local_228 [32];
  stringstream local_208 [8];
  stringstream s;
  ostream local_1f8 [399];
  allocator<int> local_69;
  undefined1 local_68 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v;
  size_t shape [3];
  ViewTest *this_local;
  
  v.geometry_.coordinateOrder_ = 3;
  v.geometry_.isSimple_ = false;
  v.geometry_._53_3_ = 0;
  shape[0] = 2;
  shape[1] = 4;
  shape[2] = (size_t)this;
  std::allocator<int>::allocator(&local_69);
  andres::View<int,true,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<int,true,std::allocator<unsigned_long>> *)local_68,
             (unsigned_long *)&v.geometry_.coordinateOrder_,shape + 2,this->data_,
             &andres::defaultOrder,&andres::defaultOrder,&local_69);
  std::allocator<int>::~allocator(&local_69);
  std::__cxx11::stringstream::stringstream(local_208);
  local_22c = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::asString_abi_cxx11_
            (local_228,(StringStyle *)local_68);
  std::operator<<(local_1f8,(string *)local_228);
  std::__cxx11::string::~string((string *)local_228);
  w.geometry_.isSimple_ = false;
  w.geometry_._53_3_ = 0;
  andres::View<int,true,std::allocator<unsigned_long>>::asString_abi_cxx11_
            (local_250,(StringStyle *)local_68);
  std::operator<<(local_1f8,(string *)local_250);
  std::__cxx11::string::~string((string *)local_250);
  std::allocator<int>::allocator(&local_299);
  andres::View<int,true,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<int,true,std::allocator<unsigned_long>> *)local_298,
             (unsigned_long *)&v.geometry_.coordinateOrder_,shape + 2,this->data_,
             &andres::defaultOrder,&andres::defaultOrder,&local_299);
  std::allocator<int>::~allocator(&local_299);
  local_2c4 = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::asString_abi_cxx11_
            (local_2c0,(StringStyle *)local_298);
  std::operator<<(local_1f8,(string *)local_2c0);
  std::__cxx11::string::~string((string *)local_2c0);
  andres::View<int,true,std::allocator<unsigned_long>>::asString_abi_cxx11_
            (local_2e8,(StringStyle *)local_298);
  std::operator<<(local_1f8,(string *)local_2e8);
  std::__cxx11::string::~string((string *)local_2e8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_298);
  std::__cxx11::stringstream::~stringstream(local_208);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_68);
  return;
}

Assistant:

void ViewTest::asStringTest()
{
    {
        std::size_t shape[3] = {3, 2, 4};

        andres::View<int, constTarget> v(&shape[0], &shape[3], data_);
        std::stringstream s;
        s << v.asString(andres::MatrixStyle);
        s << v.asString(andres::TableStyle);

        const andres::View<int, constTarget> w(&shape[0], &shape[3], data_);
        s << w.asString(andres::MatrixStyle);
        s << w.asString(andres::TableStyle);
    }
}